

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asDirectory
          (InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  Mutex *this_00;
  int iVar1;
  undefined4 extraout_var;
  Disposer *extraout_RAX;
  long in_RCX;
  String *pSVar2;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  String *ptrCopy;
  PathPtr path;
  Own<const_kj::ReadableDirectory> OVar3;
  Path newPath;
  Path local_38;
  
  if (*(int *)(in_RCX + 0x18) == 3) {
    SymlinkNode::parse(&local_38,(SymlinkNode *)(in_RCX + 0x20));
    this_00 = (Mutex *)(entry->name).content.ptr;
    if (this_00 != (Mutex *)0x0) {
      _::Mutex::unlock(this_00,SHARED);
    }
    (entry->name).content.ptr = (char *)0x0;
    (entry->name).content.size_ = 0;
    path.parts.size_ = (size_t)local_38.parts.ptr;
    path.parts.ptr = (String *)lock;
    OVar3 = (Own<const_kj::ReadableDirectory>)tryOpenSubdir(this,path);
    if (local_38.parts.ptr != (String *)0x0) {
      iVar1 = (**(local_38.parts.disposer)->_vptr_ArrayDisposer)
                        (local_38.parts.disposer,local_38.parts.ptr,0x18,local_38.parts.size_,
                         local_38.parts.size_,ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      OVar3.disposer._4_4_ = extraout_var;
      OVar3.disposer._0_4_ = iVar1;
      OVar3.ptr = extraout_RDX_00;
    }
  }
  else if (*(int *)(in_RCX + 0x18) == 2) {
    (**(code **)(**(long **)(in_RCX + 0x28) + 0x28))(&local_38);
    OVar3.ptr = extraout_RDX;
    OVar3.disposer = (Disposer *)local_38.parts.size_;
    pSVar2 = (String *)local_38.parts.size_;
    if ((String *)local_38.parts.size_ != (String *)0x0) {
      pSVar2 = local_38.parts.ptr;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar2
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
         (_func_int **)local_38.parts.size_;
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              ((Fault *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x64b,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x235dce);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_38);
    OVar3.ptr = extraout_RDX_01;
    OVar3.disposer = extraout_RAX;
  }
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)OVar3;
}

Assistant:

Maybe<Own<const ReadableDirectory>> asDirectory(
      kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<DirectoryNode>()) {
      return entry.node.get<DirectoryNode>().directory->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenSubdir(newPath);
    } else {
      KJ_FAIL_REQUIRE("not a directory") { return nullptr; }
    }
  }